

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

void Kumu::hexdump(byte_t *buf,ui32_t dump_len,FILE *stream)

{
  int iVar1;
  uint __c;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  
  if (buf != (byte_t *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stderr;
    }
    pbVar4 = buf + dump_len;
    for (; buf < pbVar4; buf = buf + 0x10) {
      fprintf((FILE *)stream,"  %06x: ");
      for (uVar2 = 0; ((uint)uVar2 < 0x10 && (buf + uVar2 < pbVar4)); uVar2 = uVar2 + 1) {
        fprintf((FILE *)stream,"%02x ",(ulong)buf[uVar2]);
      }
      for (; (uint)uVar2 < 0x10; uVar2 = (ulong)((uint)uVar2 + 1)) {
        fputs("   ",(FILE *)stream);
      }
      for (lVar3 = 0; ((uint)lVar3 < 0x10 && (buf + lVar3 < pbVar4)); lVar3 = lVar3 + 1) {
        __c = (uint)buf[lVar3];
        iVar1 = isprint(__c);
        if (iVar1 == 0) {
          __c = 0x2e;
        }
        fputc(__c,(FILE *)stream);
      }
      fputc(10,(FILE *)stream);
    }
  }
  return;
}

Assistant:

void
Kumu::hexdump(const byte_t* buf, ui32_t dump_len, FILE* stream)
{
  if ( buf == 0 )
    return;

  if ( stream == 0 )
    stream = stderr;

  static ui32_t row_len = 16;
  const byte_t* p = buf;
  const byte_t* end_p = p + dump_len;

  for ( ui32_t line = 0; p < end_p; line++ )
    {
      fprintf(stream, "  %06x: ", line);
      ui32_t i;
      const byte_t* pp;

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fprintf(stream, "%02x ", *pp);

      while ( i++ < row_len )
	fputs("   ", stream);

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fputc((isprint(*pp) ? *pp : '.'), stream);

      fputc('\n', stream);
      p += row_len;
    }
}